

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TextureVkImpl.cpp
# Opt level: O0

ImageViewWrapper * __thiscall
Diligent::TextureVkImpl::CreateImageView
          (ImageViewWrapper *__return_storage_ptr__,TextureVkImpl *this,TextureViewDesc *ViewDesc)

{
  SHADING_RATE_TEXTURE_ACCESS SVar1;
  BIND_FLAGS BVar2;
  Char *pCVar3;
  TextureFormatAttribs *pTVar4;
  VulkanLogicalDevice *this_00;
  ExtensionFeatures *pEVar5;
  GraphicsAdapterInfo *pGVar6;
  char *DebugName;
  uint *puVar7;
  char *local_250;
  allocator local_209;
  string local_208 [8];
  string ViewName;
  string msg_6;
  SHADING_RATE_TEXTURE_ACCESS ShadingRateTexAccess;
  VulkanLogicalDevice *LogicalDevice;
  string msg_5;
  string msg_4;
  TextureFormatAttribs *FmtAttribs;
  anon_class_1_0_00000001 local_14b;
  TEXTURE_FORMAT local_14a;
  undefined1 local_148 [5];
  anon_class_1_0_00000001 GetA8Swizzle;
  TEXTURE_FORMAT CorrectedViewFormat;
  string msg_3;
  char *local_120;
  uint local_114;
  uint local_110;
  uint local_10c;
  undefined1 local_108 [4];
  Uint32 MipDepth;
  string msg_2;
  string msg_1;
  VkImageViewCreateInfo ImageViewCI;
  undefined1 local_68 [8];
  string msg;
  TextureViewDesc *ViewDesc_local;
  TextureVkImpl *this_local;
  
  msg.field_2._8_8_ = ViewDesc;
  if (((((ViewDesc->ViewType != TEXTURE_VIEW_SHADER_RESOURCE) &&
        (ViewDesc->ViewType != TEXTURE_VIEW_RENDER_TARGET)) &&
       (ViewDesc->ViewType != TEXTURE_VIEW_DEPTH_STENCIL)) &&
      ((ViewDesc->ViewType != TEXTURE_VIEW_READ_ONLY_DEPTH_STENCIL &&
       (ViewDesc->ViewType != TEXTURE_VIEW_UNORDERED_ACCESS)))) &&
     (ViewDesc->ViewType != TEXTURE_VIEW_SHADING_RATE)) {
    FormatString<char[21]>((string *)local_68,(char (*) [21])"Unexpected view type");
    pCVar3 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar3,"CreateImageView",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/TextureVkImpl.cpp"
               ,0x2eb);
    std::__cxx11::string::~string((string *)local_68);
  }
  if (*(short *)(msg.field_2._8_8_ + 10) == 0) {
    *(TEXTURE_FORMAT *)(msg.field_2._8_8_ + 10) =
         (this->super_TextureBase<Diligent::EngineVkImplTraits>).
         super_DeviceObjectBase<Diligent::ITextureVk,_Diligent::RenderDeviceVkImpl,_Diligent::TextureDesc>
         .m_Desc.Format;
  }
  msg_1.field_2._8_8_ = 0xf;
  VulkanUtilities::VulkanObjectWrapper::operator_cast_to_VkImage_T_
            ((VulkanObjectWrapper *)&this->m_VulkanImage);
  puVar7 = &switchD_00380d41::switchdataD_00c2a404;
  switch(*(undefined1 *)(msg.field_2._8_8_ + 9)) {
  case 2:
    break;
  case 3:
    break;
  case 4:
    break;
  case 5:
    break;
  case 6:
    if (((*(char *)(msg.field_2._8_8_ + 8) == '\x02') ||
        (*(char *)(msg.field_2._8_8_ + 8) == '\x03')) ||
       (*(char *)(msg.field_2._8_8_ + 8) == '\x04')) {
      pGVar6 = RenderDeviceBase<Diligent::EngineVkImplTraits>::GetAdapterInfo
                         ((RenderDeviceBase<Diligent::EngineVkImplTraits> *)
                          (this->super_TextureBase<Diligent::EngineVkImplTraits>).
                          super_DeviceObjectBase<Diligent::ITextureVk,_Diligent::RenderDeviceVkImpl,_Diligent::TextureDesc>
                          .m_pDevice);
      if (((pGVar6->Texture).TextureView2DOn3DSupported & 1U) == 0) {
        FormatString<char[26],char[63]>
                  ((string *)((long)&msg_2.field_2 + 8),(Diligent *)"Debug expression failed:\n",
                   (char (*) [26])"m_pDevice->GetAdapterInfo().Texture.TextureView2DOn3DSupported",
                   (char (*) [63])puVar7);
        pCVar3 = (Char *)std::__cxx11::string::c_str();
        DebugAssertionFailed
                  (pCVar3,"CreateImageView",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/TextureVkImpl.cpp"
                   ,0x310);
        std::__cxx11::string::~string((string *)(msg_2.field_2._M_local_buf + 8));
      }
      if ((this->super_TextureBase<Diligent::EngineVkImplTraits>).
          super_DeviceObjectBase<Diligent::ITextureVk,_Diligent::RenderDeviceVkImpl,_Diligent::TextureDesc>
          .m_Desc.Usage == USAGE_SPARSE) {
        FormatString<char[54]>
                  ((string *)local_108,
                   (char (*) [54])"Can not create 2D texture view on a 3D sparse texture");
        pCVar3 = (Char *)std::__cxx11::string::c_str();
        DebugAssertionFailed
                  (pCVar3,"CreateImageView",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/TextureVkImpl.cpp"
                   ,0x311);
        std::__cxx11::string::~string((string *)local_108);
      }
      *(undefined1 *)(msg.field_2._8_8_ + 9) = 5;
    }
    else {
      local_110 = (this->super_TextureBase<Diligent::EngineVkImplTraits>).
                  super_DeviceObjectBase<Diligent::ITextureVk,_Diligent::RenderDeviceVkImpl,_Diligent::TextureDesc>
                  .m_Desc.field_3.ArraySize >>
                  ((byte)*(undefined4 *)(msg.field_2._8_8_ + 0xc) & 0x1f);
      local_114 = 1;
      puVar7 = std::max<unsigned_int>(&local_110,&local_114);
      local_10c = *puVar7;
      if ((*(int *)(msg.field_2._8_8_ + 0x14) != 0) ||
         (*(uint *)(msg.field_2._8_8_ + 0x18) != local_10c)) {
        if (*(long *)msg.field_2._8_8_ == 0) {
          local_250 = "";
        }
        else {
          local_250 = *(char **)msg.field_2._8_8_;
        }
        local_120 = local_250;
        msg_3.field_2._12_4_ = *(undefined4 *)(msg.field_2._8_8_ + 0xc);
        msg_3.field_2._8_4_ = *(undefined4 *)(msg.field_2._8_8_ + 0x10);
        LogError<false,char[18],char_const*,char[23],unsigned_int,char[15],unsigned_int,char[16],unsigned_int,char[21],unsigned_int,char[15],char_const*,char[41],unsigned_int,char[78]>
                  (false,"CreateImageView",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/TextureVkImpl.cpp"
                   ,800,(char (*) [18])"3D texture view \'",&local_120,
                   (char (*) [23])"\' (most detailed mip: ",
                   (uint *)(msg_3.field_2._M_local_buf + 0xc),(char (*) [15])"; mip levels: ",
                   (uint *)(msg_3.field_2._M_local_buf + 8),(char (*) [16])"; first slice: ",
                   (uint *)(msg.field_2._8_8_ + 0x14),(char (*) [21])"; num depth slices: ",
                   (uint *)(msg.field_2._8_8_ + 0x18),(char (*) [15])") of texture \'",
                   (char **)&(this->super_TextureBase<Diligent::EngineVkImplTraits>).
                             super_DeviceObjectBase<Diligent::ITextureVk,_Diligent::RenderDeviceVkImpl,_Diligent::TextureDesc>
                             .m_Desc,(char (*) [41])"\' does not references all depth slices (",
                   &local_10c,
                   (char (*) [78])
                   ") in the mip level. 3D texture views in Vulkan must address all depth slices.");
        *(undefined4 *)(msg.field_2._8_8_ + 0x14) = 0;
        *(uint *)(msg.field_2._8_8_ + 0x18) = local_10c;
      }
    }
    break;
  case 7:
    break;
  case 8:
    break;
  default:
    FormatString<char[26]>((string *)local_148,(char (*) [26])"Unexpected view dimension");
    pCVar3 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar3,"CreateImageView",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/TextureVkImpl.cpp"
               ,0x32f);
    std::__cxx11::string::~string((string *)local_148);
  }
  local_14a = *(TEXTURE_FORMAT *)(msg.field_2._8_8_ + 10);
  BVar2 = Diligent::operator&((this->super_TextureBase<Diligent::EngineVkImplTraits>).
                              super_DeviceObjectBase<Diligent::ITextureVk,_Diligent::RenderDeviceVkImpl,_Diligent::TextureDesc>
                              .m_Desc.BindFlags,BIND_DEPTH_STENCIL);
  if (BVar2 != BIND_NONE) {
    local_14a = GetDefaultTextureViewFormat
                          (local_14a,TEXTURE_VIEW_DEPTH_STENCIL,
                           (this->super_TextureBase<Diligent::EngineVkImplTraits>).
                           super_DeviceObjectBase<Diligent::ITextureVk,_Diligent::RenderDeviceVkImpl,_Diligent::TextureDesc>
                           .m_Desc.BindFlags);
  }
  TexFormatToVkFormat(local_14a);
  if (*(short *)(msg.field_2._8_8_ + 10) == 0x41) {
    CreateImageView::anon_class_1_0_00000001::operator()
              (&local_14b,TEXTURE_COMPONENT_SWIZZLE_R,
               *(TEXTURE_COMPONENT_SWIZZLE *)(msg.field_2._8_8_ + 0x1e));
    CreateImageView::anon_class_1_0_00000001::operator()
              (&local_14b,TEXTURE_COMPONENT_SWIZZLE_G,
               *(TEXTURE_COMPONENT_SWIZZLE *)(msg.field_2._8_8_ + 0x1f));
    CreateImageView::anon_class_1_0_00000001::operator()
              (&local_14b,TEXTURE_COMPONENT_SWIZZLE_B,
               *(TEXTURE_COMPONENT_SWIZZLE *)(msg.field_2._8_8_ + 0x20));
    CreateImageView::anon_class_1_0_00000001::operator()
              (&local_14b,TEXTURE_COMPONENT_SWIZZLE_A,
               *(TEXTURE_COMPONENT_SWIZZLE *)(msg.field_2._8_8_ + 0x21));
  }
  else {
    TextureComponentMappingToVkComponentMapping
              ((TextureComponentMapping *)(msg.field_2._8_8_ + 0x1e));
  }
  TextureDesc::IsArray
            (&(this->super_TextureBase<Diligent::EngineVkImplTraits>).
              super_DeviceObjectBase<Diligent::ITextureVk,_Diligent::RenderDeviceVkImpl,_Diligent::TextureDesc>
              .m_Desc);
  pTVar4 = GetTextureFormatAttribs(local_14a);
  if ((*(char *)(msg.field_2._8_8_ + 8) == '\x03') || (*(char *)(msg.field_2._8_8_ + 8) == '\x04'))
  {
    if ((pTVar4->ComponentType != COMPONENT_TYPE_DEPTH) &&
       (pTVar4->ComponentType != COMPONENT_TYPE_DEPTH_STENCIL)) {
      FormatString<char[58]>
                ((string *)((long)&msg_5.field_2 + 8),
                 (char (*) [58])"Unexpected component type for a depth-stencil view format");
      pCVar3 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar3,"CreateImageView",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/TextureVkImpl.cpp"
                 ,0x366);
      std::__cxx11::string::~string((string *)(msg_5.field_2._M_local_buf + 8));
    }
  }
  else if ((((pTVar4->ComponentType != COMPONENT_TYPE_DEPTH) &&
            (pTVar4->ComponentType == COMPONENT_TYPE_DEPTH_STENCIL)) &&
           (*(short *)(msg.field_2._8_8_ + 10) != 0x14)) &&
          (((*(short *)(msg.field_2._8_8_ + 10) != 0x2d &&
            (*(short *)(msg.field_2._8_8_ + 10) != 0x15)) &&
           ((*(short *)(msg.field_2._8_8_ + 10) != 0x2e &&
            ((*(short *)(msg.field_2._8_8_ + 10) != 0x16 &&
             (*(short *)(msg.field_2._8_8_ + 10) != 0x2f)))))))) {
    FormatString<char[40]>
              ((string *)&LogicalDevice,(char (*) [40])"Unexpected depth-stencil texture format");
    pCVar3 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar3,"CreateImageView",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/TextureVkImpl.cpp"
               ,0x382);
    std::__cxx11::string::~string((string *)&LogicalDevice);
  }
  this_00 = RenderDeviceVkImpl::GetLogicalDevice
                      ((this->super_TextureBase<Diligent::EngineVkImplTraits>).
                       super_DeviceObjectBase<Diligent::ITextureVk,_Diligent::RenderDeviceVkImpl,_Diligent::TextureDesc>
                       .m_pDevice);
  if ((*(char *)(msg.field_2._8_8_ + 8) == '\x06') &&
     (pEVar5 = VulkanUtilities::VulkanLogicalDevice::GetEnabledExtFeatures(this_00),
     (pEVar5->FragmentDensityMap).fragmentDensityMap != 0)) {
    pGVar6 = RenderDeviceBase<Diligent::EngineVkImplTraits>::GetAdapterInfo
                       ((RenderDeviceBase<Diligent::EngineVkImplTraits> *)
                        (this->super_TextureBase<Diligent::EngineVkImplTraits>).
                        super_DeviceObjectBase<Diligent::ITextureVk,_Diligent::RenderDeviceVkImpl,_Diligent::TextureDesc>
                        .m_pDevice);
    SVar1 = (pGVar6->ShadingRate).ShadingRateTextureAccess;
    if ((SVar1 != SHADING_RATE_TEXTURE_ACCESS_ON_GPU) &&
       ((SVar1 != SHADING_RATE_TEXTURE_ACCESS_ON_SUBMIT &&
        (SVar1 != SHADING_RATE_TEXTURE_ACCESS_ON_SET_RTV)))) {
      FormatString<char[36]>
                ((string *)((long)&ViewName.field_2 + 8),
                 (char (*) [36])"Unexpected shading rate access type");
      pCVar3 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar3,"CreateImageView",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/TextureVkImpl.cpp"
                 ,0x39d);
      std::__cxx11::string::~string((string *)(ViewName.field_2._M_local_buf + 8));
    }
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_208,"Image view for \'",&local_209);
  std::allocator<char>::~allocator((allocator<char> *)&local_209);
  std::__cxx11::string::operator+=
            (local_208,
             (this->super_TextureBase<Diligent::EngineVkImplTraits>).
             super_DeviceObjectBase<Diligent::ITextureVk,_Diligent::RenderDeviceVkImpl,_Diligent::TextureDesc>
             .m_Desc.super_DeviceObjectAttribs.Name);
  std::__cxx11::string::operator+=(local_208,'\'');
  DebugName = (char *)std::__cxx11::string::c_str();
  VulkanUtilities::VulkanLogicalDevice::CreateImageView
            (__return_storage_ptr__,this_00,(VkImageViewCreateInfo *)((long)&msg_1.field_2 + 8),
             DebugName);
  std::__cxx11::string::~string(local_208);
  return __return_storage_ptr__;
}

Assistant:

VulkanUtilities::ImageViewWrapper TextureVkImpl::CreateImageView(TextureViewDesc& ViewDesc)
{
    // clang-format off
    VERIFY(ViewDesc.ViewType == TEXTURE_VIEW_SHADER_RESOURCE ||
           ViewDesc.ViewType == TEXTURE_VIEW_RENDER_TARGET ||
           ViewDesc.ViewType == TEXTURE_VIEW_DEPTH_STENCIL ||
           ViewDesc.ViewType == TEXTURE_VIEW_READ_ONLY_DEPTH_STENCIL ||
           ViewDesc.ViewType == TEXTURE_VIEW_UNORDERED_ACCESS ||
           ViewDesc.ViewType == TEXTURE_VIEW_SHADING_RATE,
           "Unexpected view type");
    // clang-format on
    if (ViewDesc.Format == TEX_FORMAT_UNKNOWN)
    {
        ViewDesc.Format = m_Desc.Format;
    }

    VkImageViewCreateInfo ImageViewCI = {};

    ImageViewCI.sType = VK_STRUCTURE_TYPE_IMAGE_VIEW_CREATE_INFO;
    ImageViewCI.pNext = nullptr;
    ImageViewCI.flags = 0; // reserved for future use.
    ImageViewCI.image = m_VulkanImage;

    switch (ViewDesc.TextureDim)
    {
        case RESOURCE_DIM_TEX_1D:
            ImageViewCI.viewType = VK_IMAGE_VIEW_TYPE_1D;
            break;

        case RESOURCE_DIM_TEX_1D_ARRAY:
            ImageViewCI.viewType = VK_IMAGE_VIEW_TYPE_1D_ARRAY;
            break;

        case RESOURCE_DIM_TEX_2D:
            ImageViewCI.viewType = VK_IMAGE_VIEW_TYPE_2D;
            break;

        case RESOURCE_DIM_TEX_2D_ARRAY:
            ImageViewCI.viewType = VK_IMAGE_VIEW_TYPE_2D_ARRAY;
            break;

        case RESOURCE_DIM_TEX_3D:
            if (ViewDesc.ViewType == TEXTURE_VIEW_RENDER_TARGET ||
                ViewDesc.ViewType == TEXTURE_VIEW_DEPTH_STENCIL ||
                ViewDesc.ViewType == TEXTURE_VIEW_READ_ONLY_DEPTH_STENCIL)
            {
                VERIFY_EXPR(m_pDevice->GetAdapterInfo().Texture.TextureView2DOn3DSupported);
                VERIFY(m_Desc.Usage != USAGE_SPARSE, "Can not create 2D texture view on a 3D sparse texture");

                ViewDesc.TextureDim  = RESOURCE_DIM_TEX_2D_ARRAY;
                ImageViewCI.viewType = VK_IMAGE_VIEW_TYPE_2D_ARRAY;
            }
            else
            {
                ImageViewCI.viewType = VK_IMAGE_VIEW_TYPE_3D;
                Uint32 MipDepth      = std::max(m_Desc.Depth >> ViewDesc.MostDetailedMip, 1U);
                if (ViewDesc.FirstDepthSlice != 0 || ViewDesc.NumDepthSlices != MipDepth)
                {
                    LOG_ERROR("3D texture view '", (ViewDesc.Name ? ViewDesc.Name : ""), "' (most detailed mip: ", Uint32{ViewDesc.MostDetailedMip},
                              "; mip levels: ", Uint32{ViewDesc.NumMipLevels}, "; first slice: ", ViewDesc.FirstDepthSlice,
                              "; num depth slices: ", ViewDesc.NumDepthSlices, ") of texture '", m_Desc.Name,
                              "' does not references all depth slices (", MipDepth,
                              ") in the mip level. 3D texture views in Vulkan must address all depth slices.");
                    ViewDesc.FirstDepthSlice = 0;
                    ViewDesc.NumDepthSlices  = MipDepth;
                }
            }
            break;

        case RESOURCE_DIM_TEX_CUBE:
            ImageViewCI.viewType = VK_IMAGE_VIEW_TYPE_CUBE;
            break;

        case RESOURCE_DIM_TEX_CUBE_ARRAY:
            ImageViewCI.viewType = VK_IMAGE_VIEW_TYPE_CUBE_ARRAY;
            break;

        default: UNEXPECTED("Unexpected view dimension");
    }

    TEXTURE_FORMAT CorrectedViewFormat = ViewDesc.Format;
    if (m_Desc.BindFlags & BIND_DEPTH_STENCIL)
        CorrectedViewFormat = GetDefaultTextureViewFormat(CorrectedViewFormat, TEXTURE_VIEW_DEPTH_STENCIL, m_Desc.BindFlags);
    ImageViewCI.format = TexFormatToVkFormat(CorrectedViewFormat);
    if (ViewDesc.Format == TEX_FORMAT_A8_UNORM)
    {
        auto GetA8Swizzle = [](TEXTURE_COMPONENT_SWIZZLE Component, TEXTURE_COMPONENT_SWIZZLE Swizzle) {
            if (Swizzle == TEXTURE_COMPONENT_SWIZZLE_ZERO || Swizzle == TEXTURE_COMPONENT_SWIZZLE_ONE)
                return TextureComponentSwizzleToVkComponentSwizzle(Swizzle);

            if (Swizzle == TEXTURE_COMPONENT_SWIZZLE_A || (Component == TEXTURE_COMPONENT_SWIZZLE_A && Swizzle == TEXTURE_COMPONENT_SWIZZLE_IDENTITY))
                return VK_COMPONENT_SWIZZLE_R;

            return VK_COMPONENT_SWIZZLE_ZERO;
        };

        ImageViewCI.components = {
            GetA8Swizzle(TEXTURE_COMPONENT_SWIZZLE_R, ViewDesc.Swizzle.R),
            GetA8Swizzle(TEXTURE_COMPONENT_SWIZZLE_G, ViewDesc.Swizzle.G),
            GetA8Swizzle(TEXTURE_COMPONENT_SWIZZLE_B, ViewDesc.Swizzle.B),
            GetA8Swizzle(TEXTURE_COMPONENT_SWIZZLE_A, ViewDesc.Swizzle.A) //
        };
    }
    else
    {
        ImageViewCI.components = TextureComponentMappingToVkComponentMapping(ViewDesc.Swizzle);
    }

    ImageViewCI.subresourceRange.baseMipLevel = ViewDesc.MostDetailedMip;
    ImageViewCI.subresourceRange.levelCount   = ViewDesc.NumMipLevels;
    if (m_Desc.IsArray())
    {
        ImageViewCI.subresourceRange.baseArrayLayer = ViewDesc.FirstArraySlice;
        ImageViewCI.subresourceRange.layerCount     = ViewDesc.NumArraySlices;
    }
    else
    {
        ImageViewCI.subresourceRange.baseArrayLayer = 0;
        ImageViewCI.subresourceRange.layerCount     = 1;
    }

    const TextureFormatAttribs& FmtAttribs = GetTextureFormatAttribs(CorrectedViewFormat);

    if (ViewDesc.ViewType == TEXTURE_VIEW_DEPTH_STENCIL || ViewDesc.ViewType == TEXTURE_VIEW_READ_ONLY_DEPTH_STENCIL)
    {
        // When an imageView of a depth/stencil image is used as a depth/stencil framebuffer attachment,
        // the aspectMask is ignored and both depth and stencil image subresources are used. (11.5)
        if (FmtAttribs.ComponentType == COMPONENT_TYPE_DEPTH)
            ImageViewCI.subresourceRange.aspectMask = VK_IMAGE_ASPECT_DEPTH_BIT;
        else if (FmtAttribs.ComponentType == COMPONENT_TYPE_DEPTH_STENCIL)
            ImageViewCI.subresourceRange.aspectMask = VK_IMAGE_ASPECT_DEPTH_BIT | VK_IMAGE_ASPECT_STENCIL_BIT;
        else
            UNEXPECTED("Unexpected component type for a depth-stencil view format");
    }
    else
    {
        // aspectMask must be only VK_IMAGE_ASPECT_COLOR_BIT, VK_IMAGE_ASPECT_DEPTH_BIT or VK_IMAGE_ASPECT_STENCIL_BIT
        // if format is a color, depth-only or stencil-only format, respectively.  (11.5)
        if (FmtAttribs.ComponentType == COMPONENT_TYPE_DEPTH)
        {
            ImageViewCI.subresourceRange.aspectMask = VK_IMAGE_ASPECT_DEPTH_BIT;
        }
        else if (FmtAttribs.ComponentType == COMPONENT_TYPE_DEPTH_STENCIL)
        {
            if (ViewDesc.Format == TEX_FORMAT_D32_FLOAT_S8X24_UINT ||
                ViewDesc.Format == TEX_FORMAT_D24_UNORM_S8_UINT)
            {
                ImageViewCI.subresourceRange.aspectMask = VK_IMAGE_ASPECT_DEPTH_BIT | VK_IMAGE_ASPECT_STENCIL_BIT;
            }
            else if (ViewDesc.Format == TEX_FORMAT_R32_FLOAT_X8X24_TYPELESS ||
                     ViewDesc.Format == TEX_FORMAT_R24_UNORM_X8_TYPELESS)
            {
                ImageViewCI.subresourceRange.aspectMask = VK_IMAGE_ASPECT_DEPTH_BIT;
            }
            else if (ViewDesc.Format == TEX_FORMAT_X32_TYPELESS_G8X24_UINT ||
                     ViewDesc.Format == TEX_FORMAT_X24_TYPELESS_G8_UINT)
            {
                ImageViewCI.subresourceRange.aspectMask = VK_IMAGE_ASPECT_STENCIL_BIT;
            }
            else
                UNEXPECTED("Unexpected depth-stencil texture format");
        }
        else
            ImageViewCI.subresourceRange.aspectMask = VK_IMAGE_ASPECT_COLOR_BIT;
    }

    const VulkanUtilities::VulkanLogicalDevice& LogicalDevice = m_pDevice->GetLogicalDevice();

    if (ViewDesc.ViewType == TEXTURE_VIEW_SHADING_RATE)
    {
        if (LogicalDevice.GetEnabledExtFeatures().FragmentDensityMap.fragmentDensityMap != VK_FALSE)
        {
            const SHADING_RATE_TEXTURE_ACCESS ShadingRateTexAccess = m_pDevice->GetAdapterInfo().ShadingRate.ShadingRateTextureAccess;
            switch (ShadingRateTexAccess)
            {
                case SHADING_RATE_TEXTURE_ACCESS_ON_GPU:
                    ImageViewCI.flags |= VK_IMAGE_VIEW_CREATE_FRAGMENT_DENSITY_MAP_DYNAMIC_BIT_EXT;
                    break;

                case SHADING_RATE_TEXTURE_ACCESS_ON_SUBMIT:
                    ImageViewCI.flags |= VK_IMAGE_VIEW_CREATE_FRAGMENT_DENSITY_MAP_DEFERRED_BIT_EXT;
                    break;

                case SHADING_RATE_TEXTURE_ACCESS_ON_SET_RTV:
                    break;

                default:
                    UNEXPECTED("Unexpected shading rate access type");
            }
        }
    }

    std::string ViewName = "Image view for \'";
    ViewName += m_Desc.Name;
    ViewName += '\'';
    return LogicalDevice.CreateImageView(ImageViewCI, ViewName.c_str());
}